

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.h
# Opt level: O2

void __thiscall google::protobuf::util::converter::DefaultValueObjectWriter::Node::~Node(Node *this)

{
  pointer ppNVar1;
  Node *pNVar2;
  int i;
  ulong uVar3;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_003e3bb8;
  uVar3 = 0;
  while( true ) {
    ppNVar1 = (this->children_).
              super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->children_).
                      super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <= uVar3)
    break;
    pNVar2 = ppNVar1[uVar3];
    if (pNVar2 != (Node *)0x0) {
      (*pNVar2->_vptr_Node[1])();
    }
    uVar3 = uVar3 + 1;
  }
  std::_Function_base::~_Function_base(&(this->field_scrub_callback_).super__Function_base);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->path_);
  std::
  _Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
  ::~_Vector_base(&(this->children_).
                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                 );
  std::__cxx11::string::~string((string *)&this->name_);
  return;
}

Assistant:

virtual ~Node() {
      for (int i = 0; i < children_.size(); ++i) {
        delete children_[i];
      }
    }